

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddEvaluationFile
          (cmGlobalGenerator *this,string *inputFile,
          auto_ptr<cmCompiledGeneratorExpression> *outputExpr,cmMakefile *makefile,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  auto_ptr<cmCompiledGeneratorExpression> *makefile_00;
  auto_ptr<cmCompiledGeneratorExpression> *input;
  cmGeneratorExpressionEvaluationFile *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_50;
  auto_ptr<cmCompiledGeneratorExpression> local_48;
  cmGeneratorExpressionEvaluationFile *local_40;
  byte local_31;
  auto_ptr<cmCompiledGeneratorExpression> *paStack_30;
  bool inputIsContent_local;
  auto_ptr<cmCompiledGeneratorExpression> *condition_local;
  cmMakefile *makefile_local;
  auto_ptr<cmCompiledGeneratorExpression> *outputExpr_local;
  string *inputFile_local;
  cmGlobalGenerator *this_local;
  
  local_31 = inputIsContent;
  paStack_30 = condition;
  condition_local = (auto_ptr<cmCompiledGeneratorExpression> *)makefile;
  makefile_local = (cmMakefile *)outputExpr;
  outputExpr_local = (auto_ptr<cmCompiledGeneratorExpression> *)inputFile;
  inputFile_local = (string *)this;
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x58);
  input = outputExpr_local;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_48,outputExpr);
  makefile_00 = condition_local;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_50,condition);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,(string *)input,&local_48,(cmMakefile *)makefile_00,&local_50,
             (bool)(local_31 & 1));
  local_40 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::push_back(&this->EvaluationFiles,&local_40);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_50);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_48);
  return;
}

Assistant:

void cmGlobalGenerator::AddEvaluationFile(const std::string &inputFile,
                    cmsys::auto_ptr<cmCompiledGeneratorExpression> outputExpr,
                    cmMakefile *makefile,
                    cmsys::auto_ptr<cmCompiledGeneratorExpression> condition,
                    bool inputIsContent)
{
  this->EvaluationFiles.push_back(
              new cmGeneratorExpressionEvaluationFile(inputFile, outputExpr,
                                                      makefile, condition,
                                                      inputIsContent));
}